

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

string * hexstring<unsigned_char*>(string *__return_storage_ptr__,uchar *buf,int nLength,char sep)

{
  uint8_t b;
  char *pcVar1;
  char *local_38;
  char *p;
  allocator<char> local_1e;
  char local_1d;
  int local_1c;
  char sep_local;
  uint8_t *puStack_18;
  int nLength_local;
  uchar *buf_local;
  string *str;
  
  local_1d = sep;
  local_1c = nLength;
  puStack_18 = buf;
  buf_local = (uchar *)__return_storage_ptr__;
  if (nLength == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1e);
    std::allocator<char>::~allocator(&local_1e);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    while (local_38 = pcVar1, local_1c != 0) {
      b = *puStack_18;
      local_1c = local_1c + -1;
      puStack_18 = puStack_18 + 1;
      byte2hexchars(b,local_38);
      pcVar1 = local_38 + 2;
      if ((local_1d != '\0') && (local_1c != 0)) {
        *pcVar1 = local_1d;
        pcVar1 = local_38 + 3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexstring(I buf, int nLength, char sep=0)
{
    if (nLength==0)
        return "";
    std::string str;
    str.resize(nLength*2+(sep ? (nLength-1):0));
    char *p= &str[0];
    while(nLength--)
    {
        byte2hexchars(*buf++, p); p+=2;
        if (sep && nLength)
            *p++ = sep;
    }
    return str;
}